

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  uint size;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__ptr;
  char *filename_00;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  ulong uVar12;
  char *pcVar13;
  undefined8 uVar14;
  long *plVar15;
  undefined8 *puVar16;
  char *nslist;
  stat buf_1;
  char buf [500];
  char prefix [500];
  char *local_4e0;
  int local_4d8;
  int local_4d4;
  char *local_4d0;
  char *local_4c8;
  int local_4bc;
  stat64 local_4b8;
  char local_428 [499];
  undefined1 local_235;
  undefined1 local_228 [504];
  
  local_4d4 = mode;
  pcVar3 = baseFilename(filename);
  sVar4 = strlen(pcVar3);
  sVar4 = (size_t)((int)sVar4 + -4);
  memcpy(local_228,pcVar3,sVar4);
  local_228[sVar4] = 0;
  iVar1 = snprintf(local_428,499,"result/c14n/%s/%s",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  if ((iVar1 == -1 || (local_4b8.st_mode & 0xf000) != 0x8000) && ((update_results & 1) == 0)) {
    fprintf(_stderr,"Missing result file %s",local_428);
    return -1;
  }
  pcVar3 = strdup(local_428);
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.xpath",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  __ptr = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    __ptr = strdup(local_428);
  }
  local_4d8 = with_comments;
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.ns",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  filename_00 = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    filename_00 = strdup(local_428);
  }
  nb_tests = nb_tests + 1;
  local_4b8.st_dev = 0;
  local_4e0 = (char *)0x0;
  puVar5 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar5 = 6;
  iVar1 = 1;
  xmlSubstituteEntitiesDefault(1);
  lVar6 = xmlReadFile(filename,0,10);
  if (lVar6 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",filename);
    goto LAB_0010b0b7;
  }
  lVar7 = xmlDocGetRootElement(lVar6);
  if (lVar7 != 0) {
    local_4c8 = filename;
    if (__ptr != (char *)0x0) {
      puVar5 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
      *puVar5 = 6;
      xmlSubstituteEntitiesDefault(1);
      lVar7 = xmlReadFile(__ptr,0,10);
      if (lVar7 == 0) {
        lVar8 = 0;
        fprintf(_stderr,"Error: unable to parse file \"%s\"\n",__ptr);
      }
      else {
        lVar8 = xmlDocGetRootElement(lVar7);
        if (lVar8 == 0) {
          pcVar13 = "Error: empty document for file \"%s\"\n";
        }
        else {
          for (lVar8 = *(long *)(lVar7 + 0x18); lVar8 != 0; lVar8 = *(long *)(lVar8 + 0x30)) {
            iVar1 = xmlStrEqual(*(undefined8 *)(lVar8 + 0x10),"XPath");
            if (iVar1 != 0) {
              lVar9 = xmlNodeGetContent(lVar8);
              if (lVar9 == 0) {
                pcVar13 = "Error: XPath content element is NULL \"%s\"\n";
                goto LAB_0010aed7;
              }
              lVar10 = xmlXPathNewContext(lVar6);
              if (lVar10 != 0) {
                plVar15 = (long *)(lVar8 + 0x60);
                goto LAB_0010ad96;
              }
              c14nCommonTest_cold_3();
              goto LAB_0010b16a;
            }
          }
          pcVar13 = "Error: XPath element expected in the file  \"%s\"\n";
        }
LAB_0010aed7:
        lVar8 = 0;
        fprintf(_stderr,pcVar13,__ptr);
        xmlFreeDoc(lVar7);
      }
      goto LAB_0010aee9;
    }
    lVar8 = 0;
    goto LAB_0010aef2;
  }
  fprintf(_stderr,"Error: empty document for file \"%s\"\n",filename);
  xmlFreeDoc(lVar6);
  goto LAB_0010b12d;
  while (iVar1 = xmlXPathRegisterNs(lVar10,plVar15[3],plVar15[2]), iVar1 == 0) {
LAB_0010ad96:
    plVar15 = (long *)*plVar15;
    if (plVar15 == (long *)0x0) {
      lVar8 = xmlXPathEvalExpression(lVar9,lVar10);
      if (lVar8 != 0) {
        (*_xmlFree)(lVar9);
        xmlXPathFreeContext(lVar10);
        xmlFreeDoc(lVar7);
        goto LAB_0010aee9;
      }
      c14nCommonTest_cold_2();
      goto LAB_0010b16a;
    }
  }
  c14nCommonTest_cold_1();
LAB_0010b16a:
  lVar8 = 0;
LAB_0010aee9:
  if (lVar8 != 0) {
LAB_0010aef2:
    if (filename_00 == (char *)0x0) {
LAB_0010affb:
      puVar11 = (undefined8 *)0x0;
    }
    else {
      iVar1 = loadMem(filename_00,&local_4e0,&local_4bc);
      pcVar13 = local_4e0;
      if (iVar1 != 0) {
        c14nCommonTest_cold_5();
        goto LAB_0010b12d;
      }
      if (local_4e0 == (char *)0x0) goto LAB_0010affb;
      iVar1 = xmlStrlen(local_4e0);
      if ((*pcVar13 == '\'') && (pcVar13[(long)iVar1 + -1] == '\'')) {
        pcVar13[(long)iVar1 + -1] = '\0';
        pcVar13 = pcVar13 + 1;
      }
      puVar11 = (undefined8 *)(*_xmlMalloc)(8000);
      if (puVar11 == (undefined8 *)0x0) {
        perror("malloc failed");
        puVar11 = (undefined8 *)0x0;
      }
      else {
        puVar16 = puVar11;
        local_4d0 = pcVar3;
        if (*pcVar13 != '\0') {
          iVar1 = 1000;
          do {
            uVar12 = (long)puVar16 - (long)puVar11;
            if ((long)(iVar1 + -10) < (long)uVar12 >> 3) {
              iVar1 = iVar1 * 2;
              puVar11 = (undefined8 *)(*_xmlRealloc)(puVar11,(long)iVar1 << 3);
              if (puVar11 == (undefined8 *)0x0) {
                perror("realloc failed");
                puVar11 = (undefined8 *)0x0;
                pcVar3 = local_4d0;
                goto LAB_0010b016;
              }
              puVar16 = puVar11 + (int)(uVar12 >> 3);
            }
            *puVar16 = pcVar13;
            puVar16 = puVar16 + 1;
            for (; *pcVar13 != '\0'; pcVar13 = pcVar13 + 1) {
              if (*pcVar13 == ',') {
                *pcVar13 = '\0';
                pcVar13 = pcVar13 + 1;
                break;
              }
            }
          } while (*pcVar13 != '\0');
        }
        *puVar16 = 0;
        pcVar3 = local_4d0;
      }
    }
LAB_0010b016:
    if (lVar8 == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = *(undefined8 *)(lVar8 + 8);
    }
    size = xmlC14NDocDumpMemory(lVar6,uVar14,local_4d4,puVar11,local_4d8,&local_4b8);
    if ((int)size < 0) {
      fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",local_4c8,
              (ulong)size);
LAB_0010b144:
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      if (((char *)local_4b8.st_dev != (char *)0x0) &&
         (iVar2 = compareFileMem(pcVar3,(char *)local_4b8.st_dev,size), iVar2 != 0)) {
        c14nCommonTest_cold_6();
        goto LAB_0010b144;
      }
    }
    if ((char *)local_4b8.st_dev != (char *)0x0) {
      (*_xmlFree)();
    }
    if (lVar8 != 0) {
      xmlXPathFreeObject(lVar8);
    }
    if (puVar11 != (undefined8 *)0x0) {
      (*_xmlFree)(puVar11);
    }
    if (local_4e0 != (char *)0x0) {
      free(local_4e0);
    }
    xmlFreeDoc(lVar6);
    goto LAB_0010b0b7;
  }
  c14nCommonTest_cold_4();
LAB_0010b12d:
  iVar1 = 1;
LAB_0010b0b7:
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  if (filename_00 != (char *)0x0) {
    free(filename_00);
  }
  return iVar1;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    if (!checkTestFile(buf) && !update_results) {
        fprintf(stderr, "Missing result file %s", buf);
	return(-1);
    }
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}